

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::setMaximumDate(QDateTimeEdit *this,QDate max)

{
  long lVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  QDateTime local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (max.jd + 0xb69eeff91fU < 0x16d3e147974) {
    lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    uVar2 = ::QVariant::toTime();
    QDateTime::QDateTime(local_30,max.jd,uVar2,lVar1 + 0x508,1);
    setMaximumDateTime(this,local_30);
    QDateTime::~QDateTime(local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMaximumDate(QDate max)
{
    Q_D(QDateTimeEdit);
    if (max.isValid())
        setMaximumDateTime(d->dateTimeValue(max, d->maximum.toTime()));
}